

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,string_view bytes,format_specs *specs)

{
  basic_appender<char> bVar1;
  basic_appender<char> in_RCX;
  size_t in_RDX;
  anon_class_16_1_a7b7af8b *in_RSI;
  format_specs *in_RDI;
  basic_string_view<char> local_20 [2];
  
  local_20[0].data_ = (char *)in_RSI;
  local_20[0].size_ = in_RDX;
  basic_string_view<char>::size(local_20);
  bVar1 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (in_RCX,in_RDI,local_20[0].size_,(anon_class_16_1_a7b7af8b *)local_20[0].data_);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write_bytes(OutputIt out, string_view bytes,
                               const format_specs& specs = {}) -> OutputIt {
  return write_padded<Char, default_align>(
      out, specs, bytes.size(), [bytes](reserve_iterator<OutputIt> it) {
        const char* data = bytes.data();
        return copy<Char>(data, data + bytes.size(), it);
      });
}